

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  unsigned_short *puVar2;
  longlong *plVar3;
  longlong *plVar4;
  longlong *plVar5;
  unsigned_short **ppuVar6;
  pointer puVar7;
  undefined4 uVar8;
  pointer pPVar9;
  pointer pPVar10;
  undefined2 uVar11;
  ushort uVar12;
  int i;
  int iVar13;
  int iVar14;
  ushort *puVar15;
  mz_ulong __n;
  pointer pPVar16;
  byte *pbVar17;
  long lVar18;
  void *pvVar19;
  void *__s;
  longlong **__first;
  long *plVar20;
  longlong *hcode;
  undefined8 uVar21;
  uint uVar22;
  long lVar23;
  byte *pbVar24;
  pointer pPVar25;
  byte bVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  pointer pPVar30;
  int *piVar31;
  long lVar32;
  float fVar33;
  uint uVar34;
  int iVar35;
  value_type_conflict1 *__val;
  pointer pPVar36;
  short bs;
  int iVar37;
  uint uVar38;
  ulong uVar39;
  byte *pbVar40;
  longlong **pplVar41;
  int iVar42;
  int *piVar43;
  ushort uVar44;
  ulong uVar45;
  int *piVar46;
  ulong uVar47;
  int iVar48;
  uint uVar49;
  byte bVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  value_type_conflict5 *__val_2;
  pointer pPVar55;
  ushort *puVar56;
  ulong uVar57;
  ulong uVar58;
  uint uVar59;
  value_type *__val_3;
  pointer pPVar60;
  pointer pPVar61;
  int i_1;
  bool bVar62;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000001c;
  _Iter_comp_iter<tinyexr::FHeapCompare> __cmp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  int n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  pointer local_190;
  allocator_type local_179;
  pointer local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  byte *local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  void *local_138;
  ushort *local_130;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_128;
  ushort *local_110;
  long local_108;
  pointer local_100;
  byte *local_f8;
  ulong local_f0;
  long local_e8;
  longlong **local_e0;
  uint local_d8;
  int local_d4;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_d0;
  long local_c8;
  long local_c0;
  longlong **local_b8;
  ulong local_b0;
  uint local_a8;
  uint local_a4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  void *local_88;
  pointer local_80;
  pointer local_78;
  long local_70;
  ushort *local_68;
  long local_60;
  ulong local_58;
  pointer local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_178 = (pointer)CONCAT44(local_178._4_4_,param_6);
  pPVar36 = (pointer)(ulong)(uint)param_4;
  local_e0 = (longlong **)CONCAT44(local_e0._4_4_,compression_type);
  pbVar17 = (byte *)CONCAT44(in_stack_0000001c,num_lines);
  pbVar40 = (byte *)CONCAT44(in_stack_00000014,line_no);
  pPVar55 = (pointer)(long)param_4;
  local_d0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)out_data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_150,(long)x_stride * (long)pPVar55 * (long)pbVar40,(allocator_type *)&local_170)
  ;
  uVar8 = local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_;
  iVar13 = (int)local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar29 = *(long *)pbVar17;
  local_190 = (pointer)CONCAT44(local_190._4_4_,param_4);
  pPVar60 = pPVar36;
  if (*(long *)(pbVar17 + 8) != lVar29) {
    lVar23 = (long)(int)local_178;
    lVar28 = (long)width;
    uVar39 = (ulong)(uint)x_stride;
    local_158 = (byte *)(lVar23 * lVar28 * 4);
    local_178 = (pointer)(lVar28 * 4);
    local_110 = (ushort *)(lVar23 * lVar28 * 2);
    local_130 = (ushort *)(lVar28 * 2);
    uVar58 = 0;
    pbVar17 = pbVar40;
    do {
      lVar23 = lVar29 + uVar58 * 0x38;
      iVar14 = *(int *)(lVar29 + 0x20 + uVar58 * 0x38);
      if (iVar14 == 2) {
        iVar14 = *(int *)(lVar23 + 0x24);
        if (iVar14 == 1) {
          if (0 < x_stride) {
            pbVar24 = (byte *)0x0;
            uVar45 = 0;
            pbVar40 = local_158;
            do {
              lVar29 = *(long *)(*(long *)pixel_data_size + uVar58 * 8);
              if ((ulong)(CONCAT44(local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_150.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (uVar45 * (long)pbVar17 + lVar29) * (long)pPVar55) goto LAB_00110516;
              if (0 < param_4) {
                lVar29 = CONCAT44(local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) +
                         (long)(pbVar24 + lVar29) * (long)pPVar55;
                pPVar25 = (pointer)0x0;
                do {
                  uVar34 = *(uint *)(images[uVar58] + (long)pbVar40 + (long)pPVar25 * 4);
                  uVar27 = uVar34 >> 0x17;
                  uVar22 = uVar27 & 0xff;
                  if ((char)uVar27 != '\0') {
                    if (uVar22 == 0xff) {
                      uVar22 = ((uVar34 & 0x7fffff) != 0 | 0x3e) << 9;
                    }
                    else {
                      uVar59 = 0x7c00;
                      if (uVar22 < 0x8f) {
                        if (uVar22 < 0x71) {
                          uVar59 = 0;
                          if (uVar22 < 0x66) goto LAB_0010ed50;
                          uVar52 = uVar34 & 0x7fffff | 0x800000;
                          uVar59 = uVar52 >> (0x7eU - (char)uVar27 & 0x1f) & 0x3ff;
                          uVar52 = uVar52 >> (0x7d - uVar22 & 0x1f);
                        }
                        else {
                          uVar59 = (uVar34 >> 0xd & 0x3ff | (uVar27 & 0x1f) << 10) ^ 0x4000;
                          uVar52 = uVar34 >> 0xc;
                        }
                        uVar59 = uVar59 + ((uVar52 & 1) != 0);
                      }
LAB_0010ed50:
                      uVar22 = uVar59 & 0x7fff;
                      pPVar60 = (pointer)(ulong)uVar22;
                    }
                  }
                  *(char *)(lVar29 + (long)pPVar25 * 2) = (char)uVar22;
                  *(byte *)(lVar29 + 1 + (long)pPVar25 * 2) =
                       (byte)(uVar34 >> 0x18) & 0x80 | (byte)(uVar22 >> 8);
                  pPVar25 = (pointer)((long)&pPVar25->start + 1);
                } while (pPVar36 != pPVar25);
              }
              uVar45 = uVar45 + 1;
              pbVar17 = (byte *)CONCAT44(in_stack_00000014,line_no);
              pbVar24 = pbVar24 + (long)pbVar17;
              pbVar40 = pbVar40 + lVar28 * 4;
            } while (uVar45 != uVar39);
          }
        }
        else {
          if (iVar14 != 2) {
LAB_0010f1cd:
            if (channels !=
                (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
              std::__cxx11::string::append((char *)channels);
            }
            goto LAB_00110068;
          }
          if (0 < x_stride) {
            pbVar24 = (byte *)0x0;
            uVar45 = 0;
            pbVar40 = local_158;
            do {
              lVar29 = *(long *)(*(long *)pixel_data_size + uVar58 * 8);
              if ((ulong)(CONCAT44(local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_150.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (uVar45 * (long)pbVar17 + lVar29) * (long)pPVar55) goto LAB_00110508;
              if (0 < param_4) {
                pPVar25 = (pointer)0x0;
                do {
                  *(undefined4 *)
                   (CONCAT44(local_150.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) +
                    (long)(pbVar24 + lVar29) * (long)pPVar55 + (long)pPVar25 * 4) =
                       *(undefined4 *)(images[uVar58] + (long)pbVar40 + (long)pPVar25 * 4);
                  pPVar25 = (pointer)((long)&pPVar25->start + 1);
                } while (pPVar36 != pPVar25);
              }
              uVar45 = uVar45 + 1;
              pbVar17 = (byte *)CONCAT44(in_stack_00000014,line_no);
              pbVar24 = pbVar24 + (long)pbVar17;
              pbVar40 = pbVar40 + lVar28 * 4;
            } while (uVar45 != uVar39);
          }
        }
      }
      else if (iVar14 == 1) {
        iVar14 = *(int *)(lVar23 + 0x24);
        if (iVar14 == 2) {
          if (0 < x_stride) {
            pbVar40 = (byte *)0x0;
            uVar45 = 0;
            puVar15 = local_110;
            do {
              lVar29 = *(long *)(*(long *)pixel_data_size + uVar58 * 8);
              if ((ulong)(CONCAT44(local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_150.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (uVar45 * (long)pbVar17 + lVar29) * (long)pPVar55) goto LAB_00110524;
              if (0 < param_4) {
                lVar29 = CONCAT44(local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) +
                         (long)(pbVar40 + lVar29) * (long)pPVar55;
                pPVar25 = (pointer)0x0;
                do {
                  uVar12 = *(ushort *)(images[uVar58] + (long)puVar15 + (long)pPVar25 * 2);
                  uVar34 = (uint)uVar12 << 0xd;
                  if ((uVar34 & 0xf800000) == 0xf800000) {
                    fVar33 = (float)(uVar34 | 0x70000000);
                  }
                  else if ((uVar34 & 0xf800000) == 0) {
                    fVar33 = (float)(uVar34 | 0x38800000) + -6.1035156e-05;
                  }
                  else {
                    fVar33 = (float)((uVar34 & 0xfffe000) + 0x38000000);
                  }
                  *(char *)(lVar29 + (long)pPVar25 * 4) = SUB41(fVar33,0);
                  *(char *)(lVar29 + 1 + (long)pPVar25 * 4) = (char)((uint)fVar33 >> 8);
                  *(char *)(lVar29 + 2 + (long)pPVar25 * 4) = (char)((uint)fVar33 >> 0x10);
                  *(byte *)(lVar29 + 3 + (long)pPVar25 * 4) =
                       (byte)((short)uVar12 >> 0xf) & 0x80 | (byte)((uint)fVar33 >> 0x18);
                  pPVar25 = (pointer)((long)&pPVar25->start + 1);
                } while (pPVar36 != pPVar25);
              }
              uVar45 = uVar45 + 1;
              pbVar17 = (byte *)CONCAT44(in_stack_00000014,line_no);
              pbVar40 = pbVar40 + (long)pbVar17;
              puVar15 = puVar15 + lVar28;
            } while (uVar45 != uVar39);
          }
        }
        else {
          if (iVar14 != 1) goto LAB_0010f1cd;
          if (0 < x_stride) {
            pbVar40 = (byte *)0x0;
            uVar45 = 0;
            puVar15 = local_110;
            do {
              lVar29 = *(long *)(*(long *)pixel_data_size + uVar58 * 8);
              if ((ulong)(CONCAT44(local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_150.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (uVar45 * (long)pbVar17 + lVar29) * (long)pPVar55) goto LAB_00110532;
              if (0 < param_4) {
                pPVar25 = (pointer)0x0;
                do {
                  *(undefined2 *)
                   (CONCAT44(local_150.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) +
                    (long)(pbVar40 + lVar29) * (long)pPVar55 + (long)pPVar25 * 2) =
                       *(undefined2 *)(images[uVar58] + (long)puVar15 + (long)pPVar25 * 2);
                  pPVar25 = (pointer)((long)&pPVar25->start + 1);
                } while (pPVar36 != pPVar25);
              }
              uVar45 = uVar45 + 1;
              pbVar17 = (byte *)CONCAT44(in_stack_00000014,line_no);
              pbVar40 = pbVar40 + (long)pbVar17;
              puVar15 = puVar15 + lVar28;
            } while (uVar45 != uVar39);
          }
        }
      }
      else if ((iVar14 == 0) && (0 < x_stride)) {
        pbVar24 = (byte *)0x0;
        uVar45 = 0;
        pbVar40 = local_158;
        do {
          lVar29 = *(long *)(*(long *)pixel_data_size + uVar58 * 8);
          if ((ulong)(CONCAT44(local_150.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (int)local_150.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) -
                     CONCAT44(local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) <=
              (uVar45 * (long)pbVar17 + lVar29) * (long)pPVar55) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_00110508;
          }
          if (0 < param_4) {
            pPVar25 = (pointer)0x0;
            do {
              *(undefined4 *)
               (CONCAT44(local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         (int)local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) +
                (long)(pbVar24 + lVar29) * (long)pPVar55 + (long)pPVar25 * 4) =
                   *(undefined4 *)(images[uVar58] + (long)pbVar40 + (long)pPVar25 * 4);
              pPVar25 = (pointer)((long)&pPVar25->start + 1);
            } while (pPVar36 != pPVar25);
          }
          uVar45 = uVar45 + 1;
          pbVar17 = (byte *)CONCAT44(in_stack_00000014,line_no);
          pbVar24 = pbVar24 + (long)pbVar17;
          pbVar40 = pbVar40 + lVar28 * 4;
        } while (uVar45 != uVar39);
      }
      uVar58 = uVar58 + 1;
      lVar29 = *(long *)CONCAT44(in_stack_0000001c,num_lines);
    } while (uVar58 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - lVar29 >> 3) *
                             0x6db6db6db6db6db7));
  }
  if ((uint)local_e0 == 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_d0,*(undefined8 *)(local_d0 + 8),
               CONCAT44(local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_150.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start),
               CONCAT44(local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)local_150.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish));
LAB_001104d5:
    bVar62 = true;
    goto LAB_001104d7;
  }
  if (((uint)local_e0 & 0xfffffffe) == 2) {
    __n = mz_compressBound(CONCAT44(local_150.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    (int)local_150.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish) -
                           CONCAT44(local_150.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_150.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,__n,
               (allocator_type *)&local_170);
    images = (uchar **)
             local_128.
             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar60 = (pointer)((long)local_128.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_128.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    pPVar55 = pPVar60;
    if (pPVar60 == (pointer)0x0) {
LAB_00110543:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                 pPVar55);
      pPVar60 = pPVar55;
LAB_00110556:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110568:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    else {
      pvVar19 = (void *)CONCAT44(local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_150.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      pbVar17 = (byte *)CONCAT44(local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_150.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      pPVar55 = (pointer)(pbVar17 + -(long)pvVar19);
      if (pPVar55 == (pointer)0x0) goto LAB_00110543;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_170,(size_type)pPVar55,(allocator_type *)&local_a0);
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00110556;
      if (0 < (long)pPVar55) {
        lVar29 = 0;
        do {
          pbVar40 = (byte *)(lVar29 * 2 + 1 + (long)pvVar19);
          *(byte *)((long)(unsigned_short **)
                          local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar29) = pbVar40[-1];
          if (pbVar17 <= pbVar40) break;
          *(byte *)((long)(unsigned_short **)
                          local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   lVar29 + ((ulong)((long)&pPVar55->start + 1U) >> 1)) = *pbVar40;
          lVar29 = lVar29 + 1;
        } while (pbVar40 + 1 < pbVar17);
      }
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00110568;
      if (1 < (long)pPVar55) {
        pbVar40 = (byte *)((long)(unsigned_short **)
                                 local_170.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        bVar26 = *(byte *)(unsigned_short **)
                          local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        do {
          bVar50 = *pbVar40;
          *pbVar40 = (bVar50 - bVar26) + 0x80;
          pbVar40 = pbVar40 + 1;
          bVar26 = bVar50;
        } while (pbVar40 < (byte *)((long)&pPVar55->start +
                                   (long)(unsigned_short **)
                                         local_170.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start));
      }
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)mz_compressBound((mz_ulong)pPVar55);
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar13 = mz_compress((uchar *)images,(mz_ulong *)&local_a0,
                             local_170.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(mz_ulong)pPVar55);
        if ((iVar13 == 0) &&
           (pPVar60 = (pointer)local_a0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
           pPVar55 <=
           local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start)) {
          memcpy(images,pvVar19,(size_t)pPVar55);
          pPVar60 = pPVar55;
        }
        if ((pointer)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (iVar13 == 0) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_d0,*(undefined8 *)(local_d0 + 8),
                     local_128.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (byte *)((long)&(local_128.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->start +
                             ((ulong)pPVar60 & 0xffffffff)));
        }
        else if (channels !=
                 (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
          std::__cxx11::string::append((char *)channels);
        }
        if (local_128.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar13 != 0) goto LAB_00110068;
        goto LAB_001104d5;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    pPVar55 = pPVar60;
LAB_00110594:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,pPVar55
              );
LAB_001105a4:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001105b6:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001105c8:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001105e1:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001105f1:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    if ((uint)local_e0 == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
LAB_00110068:
      bVar62 = false;
LAB_001104d7:
      if ((void *)CONCAT44(local_150.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (int)local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_150.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_150.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      }
      return bVar62;
    }
    if ((uint)local_e0 != 4) {
      if ((uint)local_e0 != 1) goto LAB_00110068;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                 (ulong)((CONCAT44(local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_150.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) * 3) >> 1,
                 (allocator_type *)&local_170);
      local_178 = local_128.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pPVar60 = (pointer)((long)local_128.
                                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_128.
                               super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      pPVar55 = pPVar60;
      if (pPVar60 == (pointer)0x0) goto LAB_00110594;
      pvVar19 = (void *)CONCAT44(local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_150.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      pbVar17 = (byte *)CONCAT44(local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_150.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      pPVar55 = (pointer)(pbVar17 + -(long)pvVar19);
      if (pPVar55 == (pointer)0x0) {
        pPVar55 = (pointer)0x0;
        goto LAB_00110594;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_170,(size_type)pPVar55,(allocator_type *)&local_a0);
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001105a4;
      if (0 < (long)pPVar55) {
        lVar29 = 0;
        do {
          pbVar40 = (byte *)(lVar29 * 2 + 1 + (long)pvVar19);
          *(byte *)((long)(unsigned_short **)
                          local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar29) = pbVar40[-1];
          if (pbVar17 <= pbVar40) break;
          *(byte *)((long)(unsigned_short **)
                          local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   lVar29 + ((ulong)((long)&pPVar55->start + 1) >> 1)) = *pbVar40;
          lVar29 = lVar29 + 1;
        } while (pbVar40 + 1 < pbVar17);
      }
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001105b6;
      if (1 < (long)pPVar55) {
        pbVar40 = (byte *)((long)(unsigned_short **)
                                 local_170.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        bVar26 = *(byte *)(unsigned_short **)
                          local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        do {
          bVar50 = *pbVar40;
          *pbVar40 = (bVar50 - bVar26) + 0x80;
          pbVar40 = pbVar40 + 1;
          bVar26 = bVar50;
        } while (pbVar40 < (byte *)((long)&pPVar55->start +
                                   (long)(unsigned_short **)
                                         local_170.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start));
      }
      local_190 = pPVar60;
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pPVar36 = local_178;
        if (0 < (int)pPVar55) {
          pPVar16 = (pointer)((long)(unsigned_short **)
                                    local_170.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)(int)pPVar55);
          pPVar25 = (pointer)local_170.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
          pPVar61 = (pointer)local_170.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
LAB_0010f0c4:
          pPVar10 = (pointer)((long)&pPVar25->start + 1);
          pbVar40 = (byte *)((long)&pPVar61->start + ~(ulong)pPVar25);
          pPVar9 = (pointer)((long)&pPVar25->start + 3);
          lVar29 = (long)pPVar10 - (long)pPVar61;
          bVar26 = (char)pPVar25 - (char)pPVar61;
          do {
            bVar50 = bVar26;
            pPVar25 = pPVar10;
            lVar23 = lVar29;
            pPVar30 = pPVar9;
            pbVar17 = pbVar40;
            if ((pPVar16 <= pPVar25) || ((long)pbVar17 < -0x7f)) break;
            pbVar40 = pbVar17 + -1;
            pPVar9 = (pointer)((long)&pPVar30->start + 1);
            lVar29 = lVar23 + 1;
            pPVar10 = (pointer)((long)&pPVar25->start + 1);
            bVar26 = bVar50 + 1;
          } while (*(byte *)&pPVar61->start == *(byte *)&pPVar25->start);
          if (pbVar17 == (byte *)0xfffffffffffffffe || -(long)pbVar17 < 2) {
            if (pPVar25 < pPVar16) {
              do {
                pPVar25 = (pointer)((long)&pPVar30[-1].size + 3);
                if (((pPVar25 < pPVar16) &&
                    (bVar26 = *(byte *)((long)&pPVar30[-1].size + 3),
                    *(byte *)((long)&pPVar30[-1].size + 2) == bVar26)) && (pPVar30 < pPVar16)) {
                  if ((0x7e < lVar23) || (bVar26 == *(byte *)&pPVar30->start)) goto LAB_0010f1c7;
                }
                else if ((pPVar16 <= pPVar25) || (0x7e < lVar23)) {
                  pPVar25 = (pointer)((long)&pPVar30->start + ~(ulong)(0x7e < lVar23));
                  break;
                }
                pPVar30 = (pointer)((long)&pPVar30->start + 1);
                lVar23 = lVar23 + 1;
              } while( true );
            }
            goto LAB_0010f18c;
          }
          *(byte *)&pPVar36->start = bVar50;
          *(byte *)((long)&pPVar36->start + 1) = *(byte *)&pPVar61->start;
          pPVar36 = (pointer)((long)&pPVar36->start + 2);
          pPVar61 = pPVar25;
          goto LAB_0010f1b9;
        }
LAB_0010f5a6:
        uVar34 = (int)pPVar36 - (int)local_178;
        if ((0 < (int)uVar34) &&
           (pPVar60 = (pointer)(ulong)(uVar34 & 0x7fffffff),
           pPVar55 <= (pointer)(ulong)(uVar34 & 0x7fffffff))) {
          memcpy(local_178,pvVar19,(size_t)pPVar55);
          pPVar60 = pPVar55;
        }
        if ((pointer)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((int)uVar34 < 1) {
          if (channels !=
              (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
            std::__cxx11::string::append((char *)channels);
          }
        }
        else {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_d0,*(undefined8 *)(local_d0 + 8),
                     local_128.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (byte *)((long)&(local_128.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->start +
                             ((ulong)pPVar60 & 0xffffffff)));
        }
        if (local_128.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (0 < (int)uVar34) goto LAB_001104d5;
        goto LAB_00110068;
      }
      goto LAB_001105c8;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a0,
               (ulong)(((int)local_150.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
               (allocator_type *)&local_170);
    images = (uchar **)
             local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001105e1;
    local_88 = (void *)CONCAT44(local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_150.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    pPVar60 = (pointer)(CONCAT44(local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_150.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish) - (long)local_88);
    if (pPVar60 == (pointer)0x0) goto LAB_001105e1;
    pbVar17 = (byte *)operator_new(0x2000);
    memset(pbVar17,0,0x2000);
    local_f8 = pbVar17;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_170,
               (ulong)pPVar60 >> 1,(allocator_type *)&local_128);
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&local_128,
               (((long *)CONCAT44(in_stack_0000001c,num_lines))[1] -
                *(long *)CONCAT44(in_stack_0000001c,num_lines) >> 3) * 0x6db6db6db6db6db7,&local_179
              );
    if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001105f1;
    local_80 = (pointer)images;
    if ((long)local_128.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_128.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar29 = (long)local_128.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_128.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar29 = lVar29 + (ulong)(lVar29 == 0);
      piVar43 = (int *)(*(long *)CONCAT44(in_stack_0000001c,num_lines) + 0x24);
      piVar31 = &(local_128.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->size;
      pPVar55 = (pointer)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      do {
        ((PIZChannelData *)(piVar31 + -7))->start = (unsigned_short *)pPVar55;
        *(pointer *)(piVar31 + -5) = pPVar55;
        piVar31[-3] = param_4;
        piVar31[-2] = x_stride;
        iVar13 = *piVar43;
        *piVar31 = (iVar13 != 1) + 1;
        pPVar55 = (pointer)((long)&pPVar55->start + (long)(x_stride * param_4 << (iVar13 != 1)) * 2)
        ;
        piVar43 = piVar43 + 0xe;
        piVar31 = piVar31 + 8;
        lVar29 = lVar29 + -1;
      } while (lVar29 != 0);
    }
    local_50 = pPVar60;
    if (0 < x_stride) {
      iVar13 = 0;
      pvVar19 = local_88;
      do {
        if (local_128.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_128.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar29 = 8;
          uVar39 = 0;
          do {
            pPVar60 = local_128.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar23 = (long)*(int *)((long)&(local_128.
                                            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ny + lVar29)
                     * (long)*(int *)((long)&(local_128.
                                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->end +
                                     lVar29);
            images = (uchar **)(lVar23 * 2);
            memcpy(*(void **)((long)&(local_128.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->start + lVar29),
                   pvVar19,(size_t)images);
            pbVar40 = (byte *)((long)&pPVar60->start + lVar29);
            *(byte **)pbVar40 = (byte *)((long)&((pointer)images)->start + *(long *)pbVar40);
            pvVar19 = (void *)((long)pvVar19 + lVar23 * 2);
            uVar39 = uVar39 + 1;
            lVar29 = lVar29 + 0x20;
          } while (uVar39 < (ulong)((long)local_128.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_128.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != x_stride);
    }
    pbVar40 = local_f8;
    puVar7 = local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar17 = (byte *)((long)local_170.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_170.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 1);
    pPVar60 = (pointer)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memset(local_f8,0,0x2000);
      if (0 < (int)(uint)pbVar17) {
        uVar39 = 0;
        do {
          uVar12 = *(ushort *)((long)(unsigned_short **)puVar7 + uVar39 * 2);
          pbVar40[uVar12 >> 3] = pbVar40[uVar12 >> 3] | (byte)(1 << ((byte)uVar12 & 7));
          uVar39 = uVar39 + 1;
        } while (((uint)pbVar17 & 0x7fffffff) != uVar39);
      }
      *pbVar40 = *pbVar40 & 0xfe;
      pPVar60 = (pointer)CONCAT62((int6)((ulong)puVar7 >> 0x10),0x1fff);
      pPVar36 = (pointer)0x0;
      pPVar55 = (pointer)0x0;
      do {
        if (pbVar40[(long)pPVar55] != 0) {
          pPVar60 = (pointer)((ulong)pPVar60 & 0xffff);
          if (pPVar55 < pPVar60) {
            pPVar60 = (pointer)((ulong)pPVar55 & 0xffffffff);
          }
          pPVar36 = (pointer)((ulong)pPVar36 & 0xffff);
          if (pPVar36 < pPVar55) {
            pPVar36 = (pointer)((ulong)pPVar55 & 0xffffffff);
          }
        }
        pPVar55 = (pointer)((long)&pPVar55->start + 1);
      } while (pPVar55 != (pointer)0x2000);
      local_138 = operator_new(0x20000);
      uVar39 = 0;
      memset(local_138,0,0x20000);
      local_f0 = 0;
      do {
        if ((uVar39 == 0) || ((pbVar40[uVar39 >> 3 & 0x1fffffff] >> ((uint)uVar39 & 7) & 1) != 0)) {
          uVar11 = (undefined2)local_f0;
          local_f0 = (ulong)((int)local_f0 + 1);
        }
        else {
          uVar11 = 0;
        }
        *(undefined2 *)((long)local_138 + uVar39 * 2) = uVar11;
        uVar39 = uVar39 + 1;
      } while (uVar39 != 0x10000);
      local_108 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 1;
      local_100 = (pointer)local_170.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      images = (uchar **)0x10000;
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00110616;
      if (0 < (int)(uint)local_108) {
        uVar39 = 0;
        do {
          *(undefined2 *)
           ((long)(unsigned_short **)
                  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar39 * 2) =
               *(undefined2 *)
                ((long)local_138 +
                (ulong)*(ushort *)
                        ((long)(unsigned_short **)
                               local_170.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar39 * 2) * 2);
          uVar39 = uVar39 + 1;
        } while (((uint)local_108 & 0x7fffffff) != uVar39);
      }
      *(ushort *)&local_80->start = (ushort)pPVar60;
      *(ushort *)((long)&local_80->start + 2) = (ushort)pPVar36;
      pPVar55 = (pointer)((long)&local_80->start + 4);
      if ((ushort)pPVar60 <= (ushort)pPVar36) {
        lVar29 = ((ulong)pPVar36 & 0xffff) - ((ulong)pPVar60 & 0xffff);
        memcpy(pPVar55,pbVar40 + ((ulong)pPVar60 & 0xffff),lVar29 + 1);
        pPVar55 = (pointer)((long)pPVar55 + lVar29 + 1);
      }
      local_78 = local_128.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)local_128.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_128.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        uVar34 = (int)local_f0 - 1;
        local_f0 = (ulong)uVar34;
        local_48 = (long)local_128.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_128.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
        local_48 = local_48 + (ulong)(local_48 == 0);
        lVar29 = 0;
        do {
          local_40 = lVar29;
          iVar13 = local_128.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_40].size;
          local_e8 = (long)iVar13;
          if (0 < local_e8) {
            pPVar60 = local_128.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_40;
            puVar2 = pPVar60->start;
            uVar27 = pPVar60->nx;
            local_a8 = pPVar60->ny;
            local_d4 = uVar27 * iVar13;
            local_158 = (byte *)CONCAT44(local_158._4_4_,uVar27);
            local_d8 = local_a8;
            if ((int)uVar27 < (int)local_a8) {
              local_d8 = uVar27;
            }
            local_70 = 0;
            local_c0 = 0;
            do {
              if (1 < (int)local_d8) {
                local_68 = puVar2 + local_c0;
                uVar39 = 2;
                uVar58 = 1;
                do {
                  local_58 = uVar39;
                  iVar51 = (int)local_58;
                  iVar14 = (local_a8 - iVar51) * local_d4;
                  uVar22 = (uint)uVar58;
                  local_60 = (long)(int)(uVar22 * iVar13);
                  lVar29 = (long)(iVar51 * iVar13);
                  uVar59 = uVar34 & 0xffff;
                  puVar15 = local_68;
                  if (-1 < iVar14) {
                    local_110 = local_68 + iVar14;
                    iVar14 = (uVar27 - iVar51) * iVar13;
                    local_e0 = (longlong **)CONCAT44(local_e0._4_4_,iVar14);
                    local_38 = (long)iVar14;
                    lVar32 = (long)(int)(uVar22 * local_d4);
                    local_b0 = (ulong)(iVar51 * local_d4);
                    local_b8 = (longlong **)(local_b0 * 2);
                    lVar23 = local_60 * 2 + lVar32 * 2;
                    lVar28 = local_70;
                    do {
                      puVar56 = puVar15;
                      if (-1 < iVar14) {
                        lVar18 = lVar28;
                        do {
                          uVar52 = (uint)*(short *)((long)puVar2 + lVar18);
                          uVar12 = *(ushort *)((long)puVar2 + lVar18 + local_60 * 2);
                          if (uVar59 < 0x4000) {
                            iVar48 = uVar52 - (int)(short)uVar12;
                            iVar35 = (int)*(short *)((long)puVar2 + lVar18 + lVar32 * 2);
                            iVar37 = (int)*(short *)((long)puVar2 + lVar18 + lVar23);
                            iVar42 = iVar35 - iVar37;
                            uVar52 = (int)(short)uVar12 + uVar52;
                            uVar38 = iVar37 + iVar35;
                            *(short *)((long)puVar2 + lVar18) =
                                 (short)((uint)(((int)uVar52 >> 1) + ((int)uVar38 >> 1)) >> 1);
                            *(short *)((long)puVar2 + lVar18 + lVar32 * 2) =
                                 (short)(uVar52 >> 1) - (short)(uVar38 >> 1);
                            iVar35 = iVar48 - iVar42;
                            *(short *)((long)puVar2 + lVar18 + local_60 * 2) =
                                 (short)((uint)((int)(short)iVar48 + (int)(short)iVar42) >> 1);
                          }
                          else {
                            uVar53 = (uVar52 ^ 0x8000) & 0xffff;
                            uVar54 = uVar53 - uVar12;
                            uVar52 = (uint)*(ushort *)((long)puVar2 + lVar18 + lVar23);
                            uVar38 = *(ushort *)((long)puVar2 + lVar18 + lVar32 * 2) ^ 0x8000;
                            uVar49 = uVar38 - uVar52;
                            uVar38 = uVar49 >> 0x10 & 0x8000 ^ uVar38 + uVar52 >> 1;
                            uVar52 = uVar53 + uVar12 >> 1 ^ 0x8000 ^ uVar54 >> 0x10 & 0x8000;
                            iVar35 = uVar52 - uVar38;
                            *(ushort *)((long)puVar2 + lVar18) =
                                 (ushort)((uint)iVar35 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar38 + uVar52 >> 1);
                            *(short *)((long)puVar2 + lVar18 + lVar32 * 2) = (short)iVar35;
                            uVar52 = uVar54 & 0xffff ^ 0x8000;
                            uVar49 = uVar49 & 0xffff;
                            iVar35 = uVar52 - uVar49;
                            *(ushort *)((long)puVar2 + lVar18 + local_60 * 2) =
                                 (ushort)((uint)iVar35 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar49 + uVar52 >> 1);
                          }
                          *(short *)((long)puVar2 + lVar18 + lVar23) = (short)iVar35;
                          lVar18 = lVar18 + lVar29 * 2;
                          puVar56 = (ushort *)((long)puVar2 + lVar18);
                          local_130 = puVar15;
                        } while (puVar56 <= puVar15 + local_38);
                      }
                      if ((uVar27 & uVar22) != 0) {
                        uVar52 = (uint)(short)*puVar56;
                        uVar12 = puVar56[lVar32];
                        if (uVar59 < 0x4000) {
                          uVar44 = (ushort)((int)(short)uVar12 + uVar52 >> 1);
                          iVar35 = uVar52 - (int)(short)uVar12;
                        }
                        else {
                          uVar52 = (uVar52 ^ 0x8000) & 0xffff;
                          iVar35 = uVar52 - uVar12;
                          uVar44 = (ushort)((uint)iVar35 >> 0x10) & 0x8000 ^
                                   (ushort)(uVar52 + uVar12 >> 1);
                        }
                        puVar56[lVar32] = (ushort)iVar35;
                        *puVar56 = uVar44;
                      }
                      puVar15 = puVar15 + local_b0;
                      lVar28 = lVar28 + (long)local_b8;
                      local_a4 = uVar22;
                    } while (puVar15 <= local_110);
                  }
                  local_c8 = lVar29;
                  if (((uVar22 & local_a8) != 0) &&
                     (iVar14 = (uVar27 - iVar51) * iVar13, -1 < iVar14)) {
                    puVar56 = puVar15 + iVar14;
                    local_c8 = lVar29 * 2;
                    do {
                      uVar22 = (uint)(short)*puVar15;
                      uVar12 = puVar15[local_60];
                      if (uVar59 < 0x4000) {
                        uVar44 = (ushort)((int)(short)uVar12 + uVar22 >> 1);
                        iVar14 = uVar22 - (int)(short)uVar12;
                      }
                      else {
                        uVar22 = (uVar22 ^ 0x8000) & 0xffff;
                        iVar14 = uVar22 - uVar12;
                        uVar44 = (ushort)((uint)iVar14 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar22 + uVar12 >> 1);
                      }
                      puVar15[local_60] = (ushort)iVar14;
                      *puVar15 = uVar44;
                      puVar15 = puVar15 + lVar29;
                    } while (puVar15 <= puVar56);
                  }
                  uVar39 = (ulong)(uint)(iVar51 * 2);
                  uVar58 = local_58;
                  pbVar40 = local_f8;
                } while (iVar51 * 2 <= (int)local_d8);
              }
              local_c0 = local_c0 + 1;
              local_70 = local_70 + 2;
            } while (local_c0 != local_e8);
          }
          lVar29 = local_40 + 1;
        } while (local_40 + 1 != local_48);
      }
      *(undefined4 *)&pPVar55->start = 0;
      pbVar17 = (byte *)((long)&pPVar55->start + 4);
      local_178 = pPVar55;
      if ((int)local_108 == 0) {
        iVar13 = 0;
      }
      else {
        pvVar19 = operator_new(0x80008);
        memset(pvVar19,0,0x80008);
        if (0 < (int)(uint)local_108) {
          uVar39 = 0;
          do {
            plVar20 = (long *)((long)pvVar19 +
                              (ulong)*(ushort *)((long)&local_100->start + uVar39 * 2) * 8);
            *plVar20 = *plVar20 + 1;
            uVar39 = uVar39 + 1;
          } while (((uint)local_108 & 0x7fffffff) != uVar39);
        }
        __s = operator_new(0x40004);
        memset(__s,0,0x40004);
        __first = (longlong **)operator_new(0x80008);
        local_158 = pbVar17;
        memset(__first,0,0x80008);
        plVar20 = (long *)((long)pvVar19 + -8);
        uVar39 = 0xffffffffffffffff;
        do {
          uVar39 = uVar39 + 1;
          plVar1 = plVar20 + 1;
          plVar20 = plVar20 + 1;
        } while (*plVar1 == 0);
        iVar13 = 0;
        iVar14 = 0;
        if (uVar39 < 0x10001) {
          uVar45 = 0;
          iVar14 = 0;
          uVar58 = uVar39;
          do {
            *(int *)((long)__s + uVar58 * 4) = (int)uVar58;
            if (*plVar20 != 0) {
              __first[iVar14] = plVar20;
              iVar14 = iVar14 + 1;
              uVar45 = uVar58 & 0xffffffff;
            }
            iVar13 = (int)uVar45;
            uVar58 = uVar58 + 1;
            plVar20 = plVar20 + 1;
          } while (uVar58 != 0x10001);
        }
        local_110 = (ushort *)CONCAT44(local_110._4_4_,iVar13);
        lVar29 = (long)iVar13;
        local_130 = (ushort *)((long)pvVar19 + lVar29 * 8 + 8);
        *(undefined8 *)((long)pvVar19 + lVar29 * 8 + 8) = 1;
        __first[iVar14] = (longlong *)local_130;
        std::__make_heap<long_long**,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                  (__first,__first + (long)iVar14 + 1,
                   (_Iter_comp_iter<tinyexr::FHeapCompare> *)&local_179);
        hcode = (longlong *)operator_new(0x80008);
        memset(hcode,0,0x80008);
        if (0 < iVar14) {
          local_e0 = __first + -1;
          uVar58 = (ulong)(iVar14 + 1);
          do {
            plVar3 = *__first;
            plVar4 = __first[uVar58 - 1];
            __first[uVar58 - 1] = plVar3;
            std::
            __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                      (__first,0,(long)((long)local_e0 + (uVar58 * 8 - (long)__first)) >> 3,plVar4);
            uVar45 = uVar58 - 1;
            plVar4 = *__first;
            pplVar41 = __first + (uVar58 - 1);
            uVar47 = uVar58;
            if (1 < uVar45) {
              plVar5 = __first[uVar58 - 2];
              __first[uVar58 - 2] = plVar4;
              local_b8 = __first + (uVar58 - 1);
              local_b0 = uVar58;
              std::
              __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                        (__first,0,(long)(uVar58 * 8 + -0x10) >> 3,plVar5);
              pplVar41 = local_b8;
              uVar47 = local_b0;
            }
            uVar58 = (ulong)((long)plVar3 - (long)pvVar19) >> 3;
            uVar57 = (ulong)((long)plVar4 - (long)pvVar19) >> 3;
            plVar20 = (long *)((long)pvVar19 + (long)(int)uVar57 * 8);
            *plVar20 = *plVar20 + *(long *)((long)pvVar19 + (long)(int)uVar58 * 8);
            plVar20 = pplVar41[-1];
            lVar23 = uVar47 - 2;
            if (1 < uVar45) {
              lVar28 = *plVar20;
              do {
                lVar32 = (lVar23 - (lVar23 + -1 >> 0x3f)) + -1 >> 1;
                if (*__first[lVar32] <= lVar28) break;
                __first[lVar23] = __first[lVar32];
                bVar62 = 2 < lVar23;
                lVar23 = lVar32;
              } while (bVar62);
            }
            __first[lVar23] = plVar20;
            do {
              uVar34 = (uint)uVar57;
              lVar28 = (long)(int)uVar34;
              lVar23 = hcode[lVar28];
              hcode[lVar28] = lVar23 + 1;
              if (0x39 < lVar23) goto LAB_0010fde8;
              uVar27 = *(uint *)((long)__s + lVar28 * 4);
              uVar57 = (ulong)uVar27;
            } while (uVar27 != uVar34);
            *(int *)((long)__s + lVar28 * 4) = (int)uVar58;
            do {
              uVar34 = (uint)uVar58;
              lVar28 = (long)(int)uVar34;
              lVar23 = hcode[lVar28];
              hcode[lVar28] = lVar23 + 1;
              if (0x39 < lVar23) goto LAB_0010fde8;
              uVar27 = *(uint *)((long)__s + lVar28 * 4);
              uVar58 = (ulong)uVar27;
            } while (uVar27 != uVar34);
            uVar58 = uVar45;
          } while (2 < (long)uVar47);
        }
        hufCanonicalCodeTable(hcode);
        memcpy(pvVar19,hcode,0x80008);
LAB_0010fde8:
        lVar29 = lVar29 + 1;
        operator_delete(hcode);
        operator_delete(__first);
        operator_delete(__s);
        pbVar40 = local_f8;
        pbVar17 = local_158;
        pPVar55 = local_178;
        piVar31 = &local_178->ys;
        piVar43 = piVar31;
        if ((int)lVar29 < (int)uVar39) {
          uVar58 = 0;
          iVar51 = 0;
        }
        else {
          uVar45 = uVar39 & 0xffffffff;
          uVar58 = 0;
          iVar13 = 0;
          do {
            iVar14 = (int)uVar45;
            lVar23 = (long)iVar14;
            uVar45 = *(ulong *)((long)pvVar19 + lVar23 * 8) & 0x3f;
            if (uVar45 == 0) {
              uVar34 = 1;
              if (iVar14 <= (int)local_110) {
                uVar27 = 1;
                while (uVar34 = uVar27, (*(byte *)((long)pvVar19 + lVar23 * 8 + 8) & 0x3f) == 0) {
                  lVar23 = lVar23 + 1;
                  uVar34 = uVar27 + 1;
                  if ((lVar29 <= lVar23) || (bVar62 = 0x103 < uVar27, uVar27 = uVar34, bVar62))
                  break;
                }
                iVar14 = (int)lVar23;
              }
              if (uVar34 < 2) goto LAB_001100e6;
              if (uVar34 < 6) {
                uVar58 = uVar58 << 6 | (ulong)(uVar34 + 0x39);
                iVar51 = iVar13 + 6;
                if (iVar13 < 2) goto LAB_00110123;
                iVar13 = iVar13 + 0xe;
                do {
                  iVar51 = iVar51 + -8;
                  *(char *)piVar43 = (char)((long)uVar58 >> ((byte)iVar51 & 0x3f));
                  piVar43 = (int *)((long)piVar43 + 1);
                  iVar13 = iVar13 + -8;
                } while (0xf < iVar13);
                goto LAB_0011011c;
              }
              iVar35 = iVar13 + 6;
              uVar58 = uVar58 << 6 | 0x3f;
              if (1 < iVar13) {
                iVar13 = iVar13 + 0xe;
                do {
                  iVar51 = iVar13;
                  iVar35 = iVar35 + -8;
                  *(char *)piVar43 = (char)((long)uVar58 >> ((byte)iVar35 & 0x3f));
                  piVar43 = (int *)((long)piVar43 + 1);
                  iVar13 = iVar51 + -8;
                } while (0xf < iVar13);
                iVar35 = iVar51 + -0x10;
              }
              uVar58 = uVar58 << 8 | (ulong)(uVar34 - 6);
              iVar51 = iVar35 + 8;
              if (-1 < iVar35) {
                iVar13 = iVar35 + 0x10;
                do {
                  iVar35 = iVar13;
                  iVar51 = iVar51 + -8;
                  *(char *)piVar43 = (char)((long)uVar58 >> ((byte)iVar51 & 0x3f));
                  piVar43 = (int *)((long)piVar43 + 1);
                  iVar13 = iVar35 + -8;
                } while (0xf < iVar13);
                iVar51 = iVar35 + -0x10;
              }
            }
            else {
LAB_001100e6:
              uVar58 = uVar45 | uVar58 << 6;
              iVar51 = iVar13 + 6;
              if (1 < iVar13) {
                iVar13 = iVar13 + 0xe;
                do {
                  iVar51 = iVar51 + -8;
                  *(char *)piVar43 = (char)((long)uVar58 >> ((byte)iVar51 & 0x3f));
                  piVar43 = (int *)((long)piVar43 + 1);
                  iVar13 = iVar13 + -8;
                } while (0xf < iVar13);
LAB_0011011c:
                iVar51 = iVar13 + -8;
              }
            }
LAB_00110123:
            uVar45 = (ulong)(iVar14 + 1);
            iVar13 = iVar51;
          } while (iVar14 <= (int)local_110);
        }
        if (0 < iVar51) {
          *(char *)piVar43 = (char)(uVar58 << (8U - (char)iVar51 & 0x3f));
          piVar43 = (int *)((long)piVar43 + 1);
        }
        uVar12 = *(ushort *)&local_100->start;
        piVar46 = piVar43;
        if ((int)(uint)local_108 < 2) {
          uVar58 = 0;
          iVar13 = 0;
          iVar14 = 0;
        }
        else {
          iVar14 = 0;
          uVar45 = 1;
          iVar13 = 0;
          uVar58 = 0;
          do {
            if (iVar14 < 0xff && uVar12 == *(ushort *)((long)&local_100->start + uVar45 * 2)) {
              iVar51 = iVar14 + 1;
            }
            else {
              lVar23 = *(long *)((long)pvVar19 + (ulong)uVar12 * 8);
              lVar28 = *(long *)local_130;
              uVar59 = (uint)lVar23;
              uVar34 = uVar59 & 0x3f;
              uVar22 = (uint)lVar28;
              uVar27 = uVar22 & 0x3f;
              uVar47 = lVar23 >> 6;
              if ((long)((ulong)uVar34 + (ulong)uVar27 + 8) < (long)((ulong)uVar34 * (long)iVar14))
              {
                uVar47 = uVar58 << (sbyte)uVar34 | uVar47;
                iVar13 = (uVar59 & 0x3f) + iVar13;
                iVar35 = iVar13;
                iVar51 = iVar13;
                if (7 < iVar13) {
                  do {
                    *(char *)piVar46 = (char)((long)uVar47 >> ((byte)(iVar35 + -8) & 0x3f));
                    piVar46 = (int *)((long)piVar46 + 1);
                    iVar51 = iVar13 + -8;
                    bVar62 = 0xf < iVar13;
                    iVar13 = iVar51;
                    iVar35 = iVar35 + -8;
                  } while (bVar62);
                }
                iVar51 = (uVar22 & 0x3f) + iVar51;
                uVar58 = uVar47 << (sbyte)uVar27 | lVar28 >> 6;
                iVar13 = iVar51;
                iVar35 = iVar51;
                if (7 < iVar51) {
                  do {
                    *(char *)piVar46 = (char)((long)uVar58 >> ((byte)(iVar13 + -8) & 0x3f));
                    piVar46 = (int *)((long)piVar46 + 1);
                    iVar35 = iVar51 + -8;
                    bVar62 = 0xf < iVar51;
                    iVar51 = iVar35;
                    iVar13 = iVar13 + -8;
                  } while (bVar62);
                }
                iVar13 = iVar35 + 8;
                uVar58 = uVar58 << 8 | (long)iVar14;
                iVar51 = 0;
                if (-1 < iVar35) {
                  iVar14 = iVar35 + 0x10;
                  do {
                    iVar35 = iVar14;
                    iVar13 = iVar13 + -8;
                    *(char *)piVar46 = (char)((long)uVar58 >> ((byte)iVar13 & 0x3f));
                    piVar46 = (int *)((long)piVar46 + 1);
                    iVar14 = iVar35 + -8;
                  } while (0xf < iVar14);
                  iVar13 = iVar35 + -0x10;
                }
              }
              else {
                iVar51 = 0;
                if (-1 < iVar14) {
                  do {
                    iVar13 = iVar13 + (uVar59 & 0x3f);
                    uVar58 = uVar58 << (sbyte)uVar34 | uVar47;
                    iVar37 = iVar13;
                    iVar35 = iVar13;
                    if (7 < iVar13) {
                      do {
                        *(char *)piVar46 = (char)((long)uVar58 >> ((byte)(iVar35 + -8) & 0x3f));
                        piVar46 = (int *)((long)piVar46 + 1);
                        iVar13 = iVar37 + -8;
                        bVar62 = 0xf < iVar37;
                        iVar37 = iVar13;
                        iVar35 = iVar35 + -8;
                      } while (bVar62);
                    }
                    bVar62 = 0 < iVar14;
                    iVar14 = iVar14 + -1;
                  } while (bVar62);
                }
              }
            }
            iVar14 = iVar51;
            uVar12 = *(ushort *)((long)&local_100->start + uVar45 * 2);
            uVar45 = uVar45 + 1;
          } while (uVar45 != ((uint)local_108 & 0x7fffffff));
        }
        lVar23 = *(long *)((long)pvVar19 + (ulong)uVar12 * 8);
        lVar28 = *(long *)local_130;
        uVar59 = (uint)lVar23;
        uVar34 = uVar59 & 0x3f;
        uVar22 = (uint)lVar28;
        uVar27 = uVar22 & 0x3f;
        uVar45 = lVar23 >> 6;
        if ((long)((ulong)uVar34 + (ulong)uVar27 + 8) < (long)((ulong)uVar34 * (long)iVar14)) {
          uVar45 = uVar58 << (sbyte)uVar34 | uVar45;
          iVar13 = (uVar59 & 0x3f) + iVar13;
          iVar35 = iVar13;
          iVar51 = iVar13;
          if (7 < iVar13) {
            do {
              *(char *)piVar46 = (char)((long)uVar45 >> ((byte)(iVar35 + -8) & 0x3f));
              piVar46 = (int *)((long)piVar46 + 1);
              iVar51 = iVar13 + -8;
              bVar62 = 0xf < iVar13;
              iVar13 = iVar51;
              iVar35 = iVar35 + -8;
            } while (bVar62);
          }
          iVar51 = (uVar22 & 0x3f) + iVar51;
          uVar58 = uVar45 << (sbyte)uVar27 | lVar28 >> 6;
          iVar13 = iVar51;
          iVar35 = iVar51;
          if (7 < iVar51) {
            do {
              *(char *)piVar46 = (char)((long)uVar58 >> ((byte)(iVar13 + -8) & 0x3f));
              piVar46 = (int *)((long)piVar46 + 1);
              iVar35 = iVar51 + -8;
              bVar62 = 0xf < iVar51;
              iVar51 = iVar35;
              iVar13 = iVar13 + -8;
            } while (bVar62);
          }
          iVar13 = iVar35 + 8;
          uVar58 = uVar58 << 8 | (long)iVar14;
          if (-1 < iVar35) {
            iVar14 = iVar35 + 0x10;
            do {
              iVar51 = iVar14;
              iVar13 = iVar13 + -8;
              *(char *)piVar46 = (char)((long)uVar58 >> ((byte)iVar13 & 0x3f));
              piVar46 = (int *)((long)piVar46 + 1);
              iVar14 = iVar51 + -8;
            } while (0xf < iVar14);
            iVar13 = iVar51 + -0x10;
          }
        }
        else if (-1 < iVar14) {
          do {
            iVar35 = iVar13 + (uVar59 & 0x3f);
            uVar58 = uVar58 << (sbyte)uVar34 | uVar45;
            iVar51 = iVar35;
            iVar13 = iVar35;
            if (7 < iVar35) {
              do {
                *(char *)piVar46 = (char)((long)uVar58 >> ((byte)(iVar51 + -8) & 0x3f));
                piVar46 = (int *)((long)piVar46 + 1);
                iVar13 = iVar35 + -8;
                bVar62 = 0xf < iVar35;
                iVar35 = iVar13;
                iVar51 = iVar51 + -8;
              } while (bVar62);
            }
            bVar62 = 0 < iVar14;
            iVar14 = iVar14 + -1;
          } while (bVar62);
        }
        if (iVar13 != 0) {
          *(char *)piVar46 = (char)(uVar58 << (8U - (char)iVar13 & 0x3f));
        }
        iVar35 = (int)piVar46 - (int)piVar43;
        lVar23 = (long)piVar43 - (long)piVar31;
        iVar51 = iVar13 + iVar35 * 8 + 7;
        iVar14 = iVar13 + iVar35 * 8 + 0xe;
        if (-1 < iVar51) {
          iVar14 = iVar51;
        }
        *(byte *)((long)&local_178->start + 4) = (byte)uVar39;
        *(byte *)((long)&local_178->start + 5) = (byte)(uVar39 >> 8);
        *(byte *)((long)&local_178->start + 6) = (byte)(uVar39 >> 0x10);
        *(byte *)((long)&local_178->start + 7) = (byte)(uVar39 >> 0x18);
        *(char *)&local_178->end = (char)lVar29;
        *(char *)((long)&local_178->end + 1) = (char)((ulong)lVar29 >> 8);
        *(char *)((long)&local_178->end + 2) = (char)((ulong)lVar29 >> 0x10);
        *(char *)((long)&local_178->end + 3) = (char)((ulong)lVar29 >> 0x18);
        *(char *)((long)&local_178->end + 4) = (char)lVar23;
        *(char *)((long)&local_178->end + 5) = (char)((ulong)lVar23 >> 8);
        *(char *)((long)&local_178->end + 6) = (char)((ulong)lVar23 >> 0x10);
        *(char *)((long)&local_178->end + 7) = (char)((ulong)lVar23 >> 0x18);
        iVar13 = iVar13 + iVar35 * 8;
        *(char *)&local_178->nx = (char)iVar13;
        *(char *)((long)&local_178->nx + 1) = (char)((uint)iVar13 >> 8);
        *(char *)((long)&local_178->nx + 2) = (char)((uint)iVar13 >> 0x10);
        *(char *)((long)&local_178->nx + 3) = (char)((uint)iVar13 >> 0x18);
        iVar13 = ((iVar14 >> 3) + (int)piVar43) - (int)local_158;
        local_178->ny = 0;
        operator_delete(pvVar19);
      }
      pPVar60 = local_50;
      pvVar19 = local_138;
      *(int *)&pPVar55->start = iVar13;
      pPVar55 = (pointer)(ulong)(uint)(((int)pbVar17 - (int)local_80) + iVar13);
      if (local_50 <= pPVar55) {
        memcpy(local_80,local_88,(size_t)local_50);
        pPVar55 = (pointer)((ulong)pPVar60 & 0xffffffff);
      }
      operator_delete(pvVar19);
      if (local_128.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(pbVar40);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_d0,*(undefined8 *)(local_d0 + 8),
                 local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (byte *)((long)(unsigned_short **)
                                local_a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + (long)&pPVar55->start));
      if ((pointer)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_001104d5;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,pbVar17);
LAB_00110616:
  uVar21 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0)
  ;
  operator_delete(images);
  operator_delete(pPVar60);
  operator_delete((void *)(long)x_stride);
  operator_delete(local_190);
  operator_delete(local_138);
  if (local_128.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_f8);
  if ((pointer)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_150.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_150.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
  }
  _Unwind_Resume(uVar21);
LAB_00110508:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00110516:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00110524:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00110532:
  pbVar17 = (byte *)CONCAT44(uVar8,iVar13);
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_00110543;
LAB_0010f1c7:
  pPVar25 = (pointer)((long)&pPVar30[-1].size + 2);
LAB_0010f18c:
  *(char *)&pPVar36->start = (char)pPVar61 - (char)pPVar25;
  pPVar36 = (pointer)((long)&pPVar36->start + 1);
  if (pPVar61 < pPVar25) {
    lVar29 = (long)pPVar25 - (long)pPVar61;
    do {
      ppuVar6 = &pPVar61->start;
      pPVar61 = (pointer)((long)&pPVar61->start + 1);
      *(byte *)&pPVar36->start = *(byte *)ppuVar6;
      pPVar36 = (pointer)((long)&pPVar36->start + 1);
      lVar29 = lVar29 + -1;
    } while (lVar29 != 0);
  }
LAB_0010f1b9:
  if (pPVar16 <= pPVar61) goto LAB_0010f5a6;
  goto LAB_0010f0c4;
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if defined(TINYEXR_USE_MINIZ) && (TINYEXR_USE_MINIZ==1)
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#elif defined(TINYEXR_USE_NANOZLIB) && (TINYEXR_USE_NANOZLIB == 1)
    std::vector<unsigned char> block(nanoz_compressBound(
      static_cast<unsigned long>(buf.size())));
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "RLE compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    if (!CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines)) {
      if (err) {
        (*err) += "PIZ compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}